

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__k;
  _func_int **pp_Var1;
  char *pcVar2;
  pointer piVar3;
  char *pcVar4;
  cmCTest *pcVar5;
  pointer pcVar6;
  iterator iVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  long *plVar13;
  _func_int **pp_Var14;
  char **ppcVar15;
  string fileName;
  string line;
  ifstream fin;
  long *local_410;
  long local_408;
  long local_400 [2];
  int local_3f0;
  undefined4 uStack_3ec;
  long local_3e0 [2];
  long *local_3d0 [2];
  long local_3c0 [2];
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  _func_int *local_228;
  long lStack_220;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  iVar9 = std::__cxx11::string::compare((char *)name);
  if (iVar9 == 0) {
    pcVar2 = atts[1];
    pcVar4 = (char *)(this->PackageName)._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&this->PackageName,0,pcVar4,(ulong)pcVar2);
    std::__cxx11::string::_M_replace
              ((ulong)&this->PackagePath,0,(char *)(this->PackagePath)._M_string_length,0x5f43ef);
    return;
  }
  iVar9 = std::__cxx11::string::compare((char *)name);
  if (iVar9 != 0) {
    iVar9 = std::__cxx11::string::compare((char *)name);
    if (iVar9 != 0) {
      return;
    }
    ppcVar15 = atts + 1;
    uVar10 = 0xffffffff;
    iVar9 = -1;
    do {
      pcVar2 = ppcVar15[-1];
      if (*pcVar2 == 'n') {
        if ((pcVar2[1] == 'r') && (pcVar2[2] == '\0')) {
          uVar10 = atoi(*ppcVar15);
        }
      }
      else if (((*pcVar2 == 'c') && (pcVar2[1] == 'i')) && (pcVar2[2] == '\0')) {
        iVar9 = atoi(*ppcVar15);
      }
      ppcVar15 = ppcVar15 + 1;
    } while ((int)uVar10 < 1 || iVar9 < 0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
    piVar3 = (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar3 == (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    piVar3[(ulong)uVar10 - 1] = iVar9;
    return;
  }
  std::__cxx11::string::string((string *)&local_410,atts[1],(allocator *)local_238);
  iVar9 = std::__cxx11::string::compare((char *)&this->PackagePath);
  if (iVar9 == 0) {
    local_3d0[0] = local_3c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3d0,local_410,(long)local_410 + local_408);
    iVar9 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xe])(this,local_3d0);
    if (local_3d0[0] != local_3c0) {
      operator_delete(local_3d0[0],local_3c0[0] + 1);
    }
    if ((char)iVar9 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Cannot find file: ",0x12);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,(this->PackageName)._M_dataplus._M_p,
                           (this->PackageName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_410,local_408);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x32,(char *)local_3b0._0_8_,false);
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,
                        CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                 local_3a0[0]._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
      this->Coverage->Error = this->Coverage->Error + 1;
      goto LAB_00291a59;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Reading file: ",0xe);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,(char *)local_410,local_408);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pcVar5 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
               ,0x3a,(char *)local_3b0._0_8_,this->Coverage->Quiet);
  pp_Var1 = (_func_int **)(local_3b0 + 0x10);
  if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_3b0._0_8_,
                    CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,local_3a0[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  pcVar6 = (this->PackagePath)._M_dataplus._M_p;
  local_3b0._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,pcVar6,pcVar6 + (this->PackagePath)._M_string_length);
  std::__cxx11::string::append(local_3b0);
  plVar13 = (long *)std::__cxx11::string::_M_append(local_3b0,(ulong)local_410);
  pp_Var14 = (_func_int **)(plVar13 + 2);
  if ((_func_int **)*plVar13 == pp_Var14) {
    local_228 = *pp_Var14;
    lStack_220 = plVar13[3];
    local_238._0_8_ = &local_228;
  }
  else {
    local_228 = *pp_Var14;
    local_238._0_8_ = (_func_int **)*plVar13;
  }
  local_238._8_8_ = plVar13[1];
  *plVar13 = (long)pp_Var14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  __k = &this->FilePath;
  std::__cxx11::string::operator=((string *)__k,(string *)local_238);
  if ((_func_int **)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_228 + 1));
  }
  if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_3b0._0_8_,
                    CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,local_3a0[0]._M_local_buf[0])
                    + 1);
  }
  std::ifstream::ifstream(local_238,(__k->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Jacoco Coverage: Error opening ",0x1f);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(this->FilePath)._M_dataplus._M_p,
                         (this->FilePath)._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                 ,0x42,(char *)CONCAT44(uStack_3ec,local_3f0),false);
    if ((long *)CONCAT44(uStack_3ec,local_3f0) != local_3e0) {
      operator_delete((long *)CONCAT44(uStack_3ec,local_3f0),local_3e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
  local_3b0._8_8_ = 0;
  local_3a0[0]._M_local_buf[0] = '\0';
  local_3b0._0_8_ = pp_Var1;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->Coverage->TotalCoverage,__k);
  if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0) {
    local_3f0 = -1;
    iVar7._M_current =
         (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar7._M_current ==
        (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pmVar11,iVar7,&local_3f0);
    }
    else {
      *iVar7._M_current = -1;
      (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar7._M_current + 1;
    }
  }
  while (bVar8 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar8) {
    local_3f0 = -1;
    iVar7._M_current =
         (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar7._M_current ==
        (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pmVar11,iVar7,&local_3f0);
    }
    else {
      *iVar7._M_current = -1;
      (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar7._M_current + 1;
    }
  }
  if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_3b0._0_8_,
                    CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,local_3a0[0]._M_local_buf[0])
                    + 1);
  }
  std::ifstream::~ifstream(local_238);
LAB_00291a59:
  if (local_410 != local_400) {
    operator_delete(local_410,local_400[0] + 1);
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        this->PackagePath = "";
        }
      else if(name == "sourcefile")
        {
        std::string fileName = atts[1];

        if (this->PackagePath == "")
          {
          if(!this->FindPackagePath(fileName))
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find file: "
              << this->PackageName << "/" << fileName << std::endl);
            this->Coverage.Error++;
            return;
            }
          }

        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << fileName << std::endl,
          this->Coverage.Quiet);

        this->FilePath = this->PackagePath + "/" + fileName;
        cmsys::ifstream fin(this->FilePath.c_str());
        if (!fin)
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Jacoco Coverage: Error opening " << this->FilePath
                     << std::endl);
          }
        std::string line;
        FileLinesType& curFileLines =
          this->Coverage.TotalCoverage[this->FilePath];
        if(fin)
          {
          curFileLines.push_back(-1);
          }
        while(cmSystemTools::GetLineFromStream(fin, line))
          {
          curFileLines.push_back(-1);
          }
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->FilePath];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }